

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O0

void __thiscall
gimage::JPEGImageIO::loadHeader(JPEGImageIO *this,char *name,long *width,long *height,int *depth)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong *in_RCX;
  ulong *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  undefined4 *in_R8;
  FILE *in;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  allocator *__lhs;
  allocator local_441;
  string local_440 [8];
  string *in_stack_fffffffffffffbc8;
  IOException *in_stack_fffffffffffffbd0;
  allocator local_3c9;
  string local_3c8 [96];
  FILE *local_368;
  undefined1 local_360 [168];
  undefined8 local_2b8 [6];
  uint local_288;
  uint local_284;
  undefined4 local_280;
  undefined4 *local_28;
  ulong *local_20;
  ulong *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_368 = (FILE *)0x0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,1);
  if ((uVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c8,(char *)local_10,&local_3c9);
    std::operator+((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    std::operator+(in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
    gutil::IOException::IOException(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_368 = fopen((char *)local_10,"rb");
  if (local_368 == (FILE *)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    __lhs = &local_441;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,(char *)local_10,__lhs);
    std::operator+((char *)__lhs,local_10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)local_10);
    gutil::IOException::IOException(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_2b8[0] = jpeg_std_error(local_360);
  jpeg_CreateDecompress(local_2b8,0x50,0x290);
  jpeg_stdio_src(local_2b8,local_368);
  jpeg_read_header(local_2b8,1);
  *local_18 = (ulong)local_288;
  *local_20 = (ulong)local_284;
  *local_28 = local_280;
  jpeg_destroy_decompress(local_2b8);
  fclose(local_368);
  return;
}

Assistant:

void JPEGImageIO::loadHeader(const char *name, long &width, long &height,
                             int &depth) const
{
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  FILE   *in=0;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load JPG image ("+std::string(name)+")");
  }

  // open output file using C methods

  in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file for reading ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  jpeg_stdio_src(&cinfo, in);

  // read header information

  jpeg_read_header(&cinfo, TRUE);

  width=static_cast<long>(cinfo.image_width);
  height=static_cast<long>(cinfo.image_height);
  depth=cinfo.num_components;

  // close object and input stream

  jpeg_destroy_decompress(&cinfo);
  fclose(in);
}